

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

SharedPtr<vkt::Draw::Image> __thiscall
vkt::Draw::Image::copyToLinearImage
          (Image *this,VkQueue queue,Allocator *allocator,VkImageLayout layout,VkOffset3D offset,
          int width,int height,int depth,uint mipLevel,uint arrayElement,
          VkImageAspectFlagBits aspect,VkImageType type)

{
  DeviceInterface *pDVar1;
  VkDevice device;
  long *plVar2;
  VkCommandBuffer cmdBuffer;
  VkCommandBuffer_s *pVVar3;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  VkExtent3D _extent;
  VkResult VVar4;
  Handle<(vk::HandleType)24> *pHVar5;
  VkCommandBuffer_s **ppVVar6;
  Image *pIVar7;
  VkImage VVar8;
  VkImage VVar9;
  undefined4 in_register_0000000c;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<vkt::Draw::Image> SVar10;
  VkImageType in_stack_00000040;
  Handle<(vk::HandleType)6> local_2c0;
  undefined8 uStack_2b8;
  VkSubmitInfo submitInfo;
  VkImageCopy region;
  VkOffset3D zeroOffset;
  undefined1 local_1f8 [8];
  CmdBufferBeginInfo beginInfo;
  Move<vk::VkCommandBuffer_s_*> local_1d0;
  RefData<vk::VkCommandBuffer_s_*> local_1b0;
  undefined1 local_190 [8];
  Unique<vk::VkCommandBuffer_s_*> copyCmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_150;
  undefined1 local_130 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> copyCmdPool;
  CmdPoolCreateInfo copyCmdPoolCreateInfo;
  undefined1 local_f0 [56];
  uint local_b8;
  undefined1 local_b0 [8];
  ImageCreateInfo stagingResourceCreateInfo;
  VkExtent3D stagingExtent;
  int width_local;
  VkImageLayout layout_local;
  Allocator *allocator_local;
  VkQueue queue_local;
  Image *this_local;
  SharedPtr<vkt::Draw::Image> *stagingResource;
  
  de::SharedPtr<vkt::Draw::Image>::SharedPtr((SharedPtr<vkt::Draw::Image> *)this);
  stagingResourceCreateInfo.m_queueFamilyIndices.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = depth;
  local_b8 = mipLevel;
  local_f0._32_8_ = CONCAT44(depth,offset.z);
  local_f0._40_4_ = mipLevel;
  _extent.depth = mipLevel;
  _extent._0_8_ = local_f0._32_8_;
  local_f0._48_8_ = local_f0._32_8_;
  stagingResourceCreateInfo.m_queueFamilyIndices.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = offset.z;
  ImageCreateInfo::ImageCreateInfo
            ((ImageCreateInfo *)local_b0,in_stack_00000040,*(VkFormat *)(queue + 0x30),_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_LINEAR,2,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  createAndAlloc((Image *)local_f0,*(DeviceInterface **)(queue + 0x60),*(VkDevice *)(queue + 0x68),
                 (VkImageCreateInfo *)local_b0,(Allocator *)CONCAT44(in_register_0000000c,layout),
                 ::vk::MemoryRequirement::HostVisible);
  de::SharedPtr<vkt::Draw::Image>::operator=
            ((SharedPtr<vkt::Draw::Image> *)this,(SharedPtr<vkt::Draw::Image> *)local_f0);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)local_f0);
  CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)
             &copyCmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             0,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &copyCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             *(DeviceInterface **)(queue + 0x60),*(VkDevice *)(queue + 0x68),
             (VkCommandPoolCreateInfo *)
             &copyCmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_150,
             (Move *)&copyCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data.deleter.m_deviceIface._0_4_ = (int)local_150.deleter.m_deviceIface;
  data.object.m_internal = local_150.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_150.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_150.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_150.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_150.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_150.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_130,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &copyCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pDVar1 = *(DeviceInterface **)(queue + 0x60);
  device = *(VkDevice *)(queue + 0x68);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_130);
  beginInfo.super_VkCommandBufferBeginInfo.pInheritanceInfo =
       (VkCommandBufferInheritanceInfo *)pHVar5->m_internal;
  ::vk::allocateCommandBuffer
            (&local_1d0,pDVar1,device,
             (VkCommandPool)beginInfo.super_VkCommandBufferBeginInfo.pInheritanceInfo,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b0,(Move *)&local_1d0);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_1b0.deleter.m_deviceIface;
  data_00.object = local_1b0.object;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1b0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_1b0.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_1b0.deleter.m_device >> 0x20);
  data_00.deleter.m_pool.m_internal._0_4_ = (int)local_1b0.deleter.m_pool.m_internal;
  data_00.deleter.m_pool.m_internal._4_4_ = (int)(local_1b0.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_190,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_1d0);
  CmdBufferBeginInfo::CmdBufferBeginInfo((CmdBufferBeginInfo *)local_1f8,0);
  plVar2 = *(long **)(queue + 0x60);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
  VVar4 = (**(code **)(*plVar2 + 0x248))(plVar2,*ppVVar6,local_1f8);
  ::vk::checkResult(VVar4,"m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x1b5);
  pDVar1 = *(DeviceInterface **)(queue + 0x60);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
  cmdBuffer = *ppVVar6;
  pIVar7 = de::SharedPtr<vkt::Draw::Image>::operator->((SharedPtr<vkt::Draw::Image> *)this);
  VVar8 = object(pIVar7);
  transition2DImage(pDVar1,cmdBuffer,VVar8,type,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,0,
                    0);
  plVar2 = *(long **)(queue + 0x60);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
  pVVar3 = *ppVVar6;
  VVar8 = object((Image *)queue);
  pIVar7 = de::SharedPtr<vkt::Draw::Image>::operator->((SharedPtr<vkt::Draw::Image> *)this);
  VVar9 = object(pIVar7);
  (**(code **)(*plVar2 + 0x300))(plVar2,pVVar3,VVar8.m_internal,offset.x,VVar9.m_internal,1);
  plVar2 = *(long **)(queue + 0x60);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
  VVar4 = (**(code **)(*plVar2 + 0x250))(plVar2,*ppVVar6);
  ::vk::checkResult(VVar4,"m_vk.endCommandBuffer(*copyCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x1bd);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_2b8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_190);
  plVar2 = *(long **)(queue + 0x60);
  ::vk::Handle<(vk::HandleType)6>::Handle(&local_2c0,0);
  (**(code **)(*plVar2 + 0x10))(plVar2,allocator,1,&uStack_2b8,local_2c0.m_internal);
  VVar4 = (**(code **)(**(long **)(queue + 0x60) + 0x18))(*(long **)(queue + 0x60),allocator);
  ::vk::checkResult(VVar4,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x1ce);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_190);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_130);
  ImageCreateInfo::~ImageCreateInfo((ImageCreateInfo *)local_b0);
  SVar10.m_state = extraout_RDX;
  SVar10.m_ptr = this;
  return SVar10;
}

Assistant:

de::SharedPtr<Image> Image::copyToLinearImage (vk::VkQueue					queue,
											   vk::Allocator&				allocator,
											   vk::VkImageLayout			layout,
											   vk::VkOffset3D				offset,
											   int							width,
											   int							height,
											   int							depth,
											   unsigned int					mipLevel,
											   unsigned int					arrayElement,
											   vk::VkImageAspectFlagBits	aspect,
											   vk::VkImageType				type)
{
	de::SharedPtr<Image> stagingResource;
	{
		vk::VkExtent3D stagingExtent = {(deUint32)width, (deUint32)height, (deUint32)depth};
		ImageCreateInfo stagingResourceCreateInfo(type, m_format, stagingExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT,
												  vk::VK_IMAGE_TILING_LINEAR, vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

		stagingResource = Image::createAndAlloc(m_vk, m_device, stagingResourceCreateInfo, allocator,
												vk::MemoryRequirement::HostVisible);

		//todo [scygan] get proper queueFamilyIndex
		CmdPoolCreateInfo copyCmdPoolCreateInfo(0);
		vk::Unique<vk::VkCommandPool> copyCmdPool(vk::createCommandPool(m_vk, m_device, &copyCmdPoolCreateInfo));
		vk::Unique<vk::VkCommandBuffer> copyCmdBuffer(vk::allocateCommandBuffer(m_vk, m_device, *copyCmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		CmdBufferBeginInfo beginInfo;
		VK_CHECK(m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo));

		transition2DImage(m_vk, *copyCmdBuffer, stagingResource->object(), aspect, vk::VK_IMAGE_LAYOUT_UNDEFINED, vk::VK_IMAGE_LAYOUT_GENERAL);

		const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
		vk::VkImageCopy region = { { (vk::VkImageAspectFlags)aspect, mipLevel, arrayElement, 1}, offset, { (vk::VkImageAspectFlags)aspect, 0, 0, 1}, zeroOffset, {(deUint32)width, (deUint32)height, (deUint32)depth} };

		m_vk.cmdCopyImage(*copyCmdBuffer, object(), layout, stagingResource->object(), vk::VK_IMAGE_LAYOUT_GENERAL, 1, &region);
		VK_CHECK(m_vk.endCommandBuffer(*copyCmdBuffer));

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&copyCmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// TODO: make this less intrusive
		VK_CHECK(m_vk.queueWaitIdle(queue));
	}
	return stagingResource;
}